

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_hash.c
# Opt level: O0

ion_status_t oah_insert(ion_hashmap_t *hash_map,ion_key_t key,ion_value_t value)

{
  ion_status_t iVar1;
  char cVar2;
  int num;
  char *pcVar3;
  ion_hash_bucket_t *item;
  int local_30;
  int count;
  int loc;
  ion_hash_t hash;
  ion_value_t value_local;
  ion_key_t key_local;
  ion_hashmap_t *hash_map_local;
  
  num = (*hash_map->compute_hash)(hash_map,key,(hash_map->super).record.key_size);
  local_30 = oah_get_location(num,hash_map->map_size);
  item._4_4_ = 0;
  do {
    if (item._4_4_ == hash_map->map_size) {
      hash_map_local._0_4_ = CONCAT31(hash_map_local._1_3_,3);
      hash_map_local._4_4_ = 0;
LAB_0010b405:
      iVar1.count = hash_map_local._4_4_;
      iVar1._0_4_ = (int)hash_map_local;
      return iVar1;
    }
    pcVar3 = hash_map->entry +
             ((hash_map->super).record.key_size + (hash_map->super).record.value_size + 1) *
             local_30;
    if (*pcVar3 == -3) {
      cVar2 = (*(hash_map->super).compare)(pcVar3 + 1,key,(hash_map->super).record.key_size);
      if (cVar2 == '\0') {
        if (hash_map->write_concern == '\x01') {
          hash_map_local._0_4_ = CONCAT31(hash_map_local._1_3_,2);
          hash_map_local._4_4_ = 0;
        }
        else if (hash_map->write_concern == '\0') {
          memcpy(pcVar3 + (long)(hash_map->super).record.key_size + 1,value,
                 (long)(hash_map->super).record.value_size);
          hash_map_local._0_4_ = (uint)hash_map_local._1_3_ << 8;
          hash_map_local._4_4_ = 1;
        }
        else {
          hash_map_local._0_4_ = CONCAT31(hash_map_local._1_3_,7);
          hash_map_local._4_4_ = 0;
        }
        goto LAB_0010b405;
      }
    }
    else if ((*pcVar3 == -1) || (*pcVar3 == -2)) {
      *pcVar3 = -3;
      memcpy(pcVar3 + 1,key,(long)(hash_map->super).record.key_size);
      memcpy(pcVar3 + (long)(hash_map->super).record.key_size + 1,value,
             (long)(hash_map->super).record.value_size);
      hash_map_local._0_4_ = (uint)hash_map_local._1_3_ << 8;
      hash_map_local._4_4_ = 1;
      goto LAB_0010b405;
    }
    local_30 = local_30 + 1;
    if (hash_map->map_size <= local_30) {
      local_30 = 0;
    }
    item._4_4_ = item._4_4_ + 1;
  } while( true );
}

Assistant:

ion_status_t
oah_insert(
	ion_hashmap_t	*hash_map,
	ion_key_t		key,
	ion_value_t		value
) {
	ion_hash_t hash = hash_map->compute_hash(hash_map, key, hash_map->super.record.key_size);	/* compute hash value for given key */

	int loc			= oah_get_location(hash, hash_map->map_size);

	/* Scan until find an empty location - oah_insert if found */
	int count		= 0;

	ion_hash_bucket_t *item;

	while (count != hash_map->map_size) {
		item = ((ion_hash_bucket_t *) ((hash_map->entry + (hash_map->super.record.key_size + hash_map->super.record.value_size + SIZEOF(STATUS)) * loc)));

		if (item->status == ION_IN_USE) {
			/* if a cell is in use, need to key to */

			if (hash_map->super.compare(item->data, key, hash_map->super.record.key_size) == ION_IS_EQUAL) {
				if (hash_map->write_concern == wc_insert_unique) {
					/* allow unique entries only */
					return ION_STATUS_ERROR(err_duplicate_key);
				}
				else if (hash_map->write_concern == wc_update) {
					/* allows for values to be updated */
					memcpy(item->data + hash_map->super.record.key_size, value, (hash_map->super.record.value_size));
					return ION_STATUS_OK(1);
				}
				else {
					return ION_STATUS_ERROR(err_file_write_error);	/* there is a configuration issue with write concern */
				}
			}
		}
		else if ((item->status == ION_EMPTY) || (item->status == ION_DELETED)) {
			/* problem is here with base types as it is just an array of data.  Need better way */
			item->status = ION_IN_USE;
			memcpy(item->data, key, (hash_map->super.record.key_size));
			memcpy(item->data + hash_map->super.record.key_size, value, (hash_map->super.record.value_size));
			return ION_STATUS_OK(1);
		}

		loc++;

		if (loc >= hash_map->map_size) {
			/* Perform wrapping */
			loc = 0;
		}

#if ION_DEBUG
		printf("checking location %i\n", loc);
#endif
		count++;
	}

#if ION_DEBUG
	printf("Hash table full.  Insert not done");
#endif

	return ION_STATUS_ERROR(err_max_capacity);
}